

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::UnCamelCaseFieldName
                   (string *name,FieldDescriptor *field)

{
  bool bVar1;
  char cVar2;
  Type TVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  string *in_RSI;
  string *in_RDI;
  char c;
  int i;
  string worker;
  string *result;
  string *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  string *in_stack_fffffffffffffe60;
  bool local_162;
  int local_130;
  allocator local_121;
  string local_120 [32];
  string local_100 [37];
  byte local_db;
  byte local_da;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"_p",&local_59);
  bVar1 = HasSuffixString(in_stack_fffffffffffffe60,
                          (string *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"_p",&local_b1);
    StripSuffixString((string *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                      in_stack_fffffffffffffe50);
    std::__cxx11::string::operator=(local_38,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  local_da = 0;
  local_db = 0;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4987b5);
  local_162 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_da = 1;
    std::__cxx11::string::string(local_d8,"Array",&local_d9);
    local_db = 1;
    local_162 = HasSuffixString(in_stack_fffffffffffffe60,
                                (string *)
                                CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  }
  if ((local_db & 1) != 0) {
    std::__cxx11::string::~string(local_d8);
  }
  if ((local_da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  if (local_162 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"Array",&local_121);
    StripSuffixString((string *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                      in_stack_fffffffffffffe50);
    std::__cxx11::string::operator=(local_38,local_100);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  TVar3 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffe50);
  if (TVar3 == TYPE_GROUP) {
    lVar4 = std::__cxx11::string::length();
    if (lVar4 != 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      bVar1 = ascii_islower(*pcVar5);
      if (bVar1) {
        std::__cxx11::string::operator[]((ulong)local_38);
        cVar2 = ascii_toupper('\0');
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        *pcVar5 = cVar2;
      }
    }
    std::__cxx11::string::string((string *)in_RDI,local_38);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    for (local_130 = 0; uVar6 = std::__cxx11::string::size(), (ulong)(long)local_130 < uVar6;
        local_130 = local_130 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      cVar2 = *pcVar5;
      bVar1 = ascii_isupper(cVar2);
      if (bVar1) {
        if (0 < local_130) {
          std::__cxx11::string::operator+=((string *)in_RDI,'_');
        }
        cVar2 = ascii_tolower('\0');
        std::__cxx11::string::operator+=((string *)in_RDI,cVar2);
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,cVar2);
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

string UnCamelCaseFieldName(const string& name, const FieldDescriptor* field) {
  string worker(name);
  if (HasSuffixString(worker, "_p")) {
    worker = StripSuffixString(worker, "_p");
  }
  if (field->is_repeated() && HasSuffixString(worker, "Array")) {
    worker = StripSuffixString(worker, "Array");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    if (worker.length() > 0) {
      if (ascii_islower(worker[0])) {
        worker[0] = ascii_toupper(worker[0]);
      }
    }
    return worker;
  } else {
    string result;
    for (int i = 0; i < worker.size(); i++) {
      char c = worker[i];
      if (ascii_isupper(c)) {
        if (i > 0) {
          result += '_';
        }
        result += ascii_tolower(c);
      } else {
        result += c;
      }
    }
    return result;
  }
}